

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_variance_sse4.c
# Opt level: O0

void hbd_obmc_variance_w8n
               (uint8_t *pre8,int pre_stride,int32_t *wsrc,int32_t *mask,uint64_t *sse,int64_t *sum,
               int w,int h)

{
  __m128i v_d;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int64_t iVar5;
  long in_RCX;
  long in_RDX;
  int iVar6;
  longlong in_RSI;
  long in_RDI;
  long *in_R8;
  long *in_R9;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  longlong extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 extraout_XMM0_Qb_03;
  longlong extraout_XMM0_Qb_04;
  __m128i alVar9;
  __m128i v_val_d;
  __m128i v_val_d_00;
  __m128i v_sqrdiff_d;
  __m128i v_rdiff01_w;
  __m128i v_rdiff1_d;
  __m128i v_rdiff0_d;
  __m128i v_diff1_d;
  __m128i v_diff0_d;
  __m128i v_pm1_d;
  __m128i v_pm0_d;
  __m128i v_p1_d;
  __m128i v_p0_d;
  __m128i v_w0_d;
  __m128i v_m0_d;
  __m128i v_p0_w;
  __m128i v_w1_d;
  __m128i v_m1_d;
  __m128i v_p1_w;
  __m128i v_sse_d;
  __m128i v_sum_d;
  int n;
  int pre_step;
  uint16_t *pre;
  longlong lVar10;
  longlong lVar11;
  undefined4 local_1a8;
  undefined8 local_1a0;
  
  iVar6 = (int)in_RSI;
  local_1a0 = in_RDI * 2;
  local_1a8 = 0;
  do {
    xx_loadl_64((void *)(local_1a0 + 8 + (long)local_1a8 * 2));
    xx_load_128((void *)(in_RCX + 0x10 + (long)local_1a8 * 4));
    xx_load_128((void *)(in_RDX + 0x10 + (long)local_1a8 * 4));
    xx_loadl_64((void *)(local_1a0 + (long)local_1a8 * 2));
    xx_load_128((void *)(in_RCX + (long)local_1a8 * 4));
    alVar9 = xx_load_128((void *)(in_RDX + (long)local_1a8 * 4));
    auVar7._8_8_ = extraout_XMM0_Qb_01;
    auVar7._0_8_ = extraout_XMM0_Qa_01;
    auVar7 = pmovzxwd(auVar7,extraout_XMM0_Qa_01);
    auVar8._8_8_ = extraout_XMM0_Qb;
    auVar8._0_8_ = extraout_XMM0_Qa;
    auVar8 = pmovzxwd(auVar8,extraout_XMM0_Qa);
    auVar2._8_8_ = extraout_XMM0_Qb_02;
    auVar2._0_8_ = extraout_XMM0_Qa_02;
    pmaddwd(auVar7,auVar2);
    auVar1._8_8_ = extraout_XMM0_Qb_00;
    auVar1._0_8_ = extraout_XMM0_Qa_00;
    pmaddwd(auVar8,auVar1);
    v_val_d[1] = in_RSI;
    v_val_d[0] = 0xc;
    alVar9 = xx_roundn_epi32(v_val_d,(int)alVar9[1]);
    v_val_d_00[1] = in_RSI;
    v_val_d_00[0] = 0xc;
    lVar11 = extraout_XMM0_Qa_03;
    xx_roundn_epi32(v_val_d_00,(int)alVar9[1]);
    auVar4._8_8_ = extraout_XMM0_Qb_03;
    auVar4._0_8_ = lVar11;
    auVar3._8_8_ = extraout_XMM0_Qb_04;
    auVar3._0_8_ = extraout_XMM0_Qa_04;
    auVar7 = packssdw(auVar4,auVar3);
    pmaddwd(auVar7,auVar7);
    local_1a8 = local_1a8 + 8;
    if (local_1a8 % (int)v_sqrdiff_d[1] == 0) {
      local_1a0 = local_1a0 + (long)(iVar6 - (int)v_sqrdiff_d[1]) * 2;
    }
  } while (local_1a8 < (int)v_sqrdiff_d[1] * (int)v_rdiff01_w[0]);
  alVar9[1] = lVar11;
  alVar9[0] = extraout_XMM0_Qb_04;
  lVar10 = extraout_XMM0_Qb_04;
  iVar5 = xx_hsum_epi32_si64(alVar9);
  *in_R9 = iVar5 + *in_R9;
  v_d[1] = lVar11;
  v_d[0] = lVar10;
  iVar5 = xx_hsum_epi32_si64(v_d);
  *in_R8 = iVar5 + *in_R8;
  return;
}

Assistant:

static inline void hbd_obmc_variance_w8n(
    const uint8_t *pre8, const int pre_stride, const int32_t *wsrc,
    const int32_t *mask, uint64_t *const sse, int64_t *const sum, const int w,
    const int h) {
  const uint16_t *pre = CONVERT_TO_SHORTPTR(pre8);
  const int pre_step = pre_stride - w;
  int n = 0;
  __m128i v_sum_d = _mm_setzero_si128();
  __m128i v_sse_d = _mm_setzero_si128();

  assert(w >= 8);
  assert(IS_POWER_OF_TWO(w));
  assert(IS_POWER_OF_TWO(h));

  do {
    const __m128i v_p1_w = xx_loadl_64(pre + n + 4);
    const __m128i v_m1_d = xx_load_128(mask + n + 4);
    const __m128i v_w1_d = xx_load_128(wsrc + n + 4);
    const __m128i v_p0_w = xx_loadl_64(pre + n);
    const __m128i v_m0_d = xx_load_128(mask + n);
    const __m128i v_w0_d = xx_load_128(wsrc + n);

    const __m128i v_p0_d = _mm_cvtepu16_epi32(v_p0_w);
    const __m128i v_p1_d = _mm_cvtepu16_epi32(v_p1_w);

    // Values in both pre and mask fit in 15 bits, and are packed at 32 bit
    // boundaries. We use pmaddwd, as it has lower latency on Haswell
    // than pmulld but produces the same result with these inputs.
    const __m128i v_pm0_d = _mm_madd_epi16(v_p0_d, v_m0_d);
    const __m128i v_pm1_d = _mm_madd_epi16(v_p1_d, v_m1_d);

    const __m128i v_diff0_d = _mm_sub_epi32(v_w0_d, v_pm0_d);
    const __m128i v_diff1_d = _mm_sub_epi32(v_w1_d, v_pm1_d);

    const __m128i v_rdiff0_d = xx_roundn_epi32(v_diff0_d, 12);
    const __m128i v_rdiff1_d = xx_roundn_epi32(v_diff1_d, 12);
    const __m128i v_rdiff01_w = _mm_packs_epi32(v_rdiff0_d, v_rdiff1_d);
    const __m128i v_sqrdiff_d = _mm_madd_epi16(v_rdiff01_w, v_rdiff01_w);

    v_sum_d = _mm_add_epi32(v_sum_d, v_rdiff0_d);
    v_sum_d = _mm_add_epi32(v_sum_d, v_rdiff1_d);
    v_sse_d = _mm_add_epi32(v_sse_d, v_sqrdiff_d);

    n += 8;

    if (n % w == 0) pre += pre_step;
  } while (n < w * h);

  *sum += xx_hsum_epi32_si64(v_sum_d);
  *sse += xx_hsum_epi32_si64(v_sse_d);
}